

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O2

void __thiscall test::OWDTimeStatistics::PrintStatistics(OWDTimeStatistics *this)

{
  OWDTimeStatistics *pOVar1;
  ostringstream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  float fVar22;
  uint uVar23;
  OutputWorker *pOVar24;
  OWDTimeStatistics *pOVar25;
  OWDTimeStatistics *pOVar26;
  _ValueType __value;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  OWDTimeStatistics *pOVar30;
  unsigned_long uVar31;
  OWDTimeStatistics *pOVar32;
  OWDTimeStatistics *pOVar33;
  unsigned_long *__i_1;
  long lVar34;
  unsigned_long __tmp_1;
  ulong uVar35;
  value_type_conflict1 __val_6;
  OWDTimeStatistics *pOVar36;
  unsigned_long *__i;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM1 [16];
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1bc;
  LogStringBuffer local_1b8;
  
  uVar35 = (ulong)this->SampleCount;
  local_1bc = 0.0;
  fVar22 = local_1bc;
  if (200 < uVar35) {
    auVar21 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auVar21._0_8_ * 0.99;
    uVar27 = vcvttsd2usi_avx512f(auVar38);
    pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
    if (uVar27 != uVar35) {
      uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
      pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
      pOVar36 = this;
      while (pOVar32 = pOVar30, 0x18 < (long)pOVar32 - (long)pOVar36) {
        bVar37 = uVar27 == 0;
        uVar27 = uVar27 - 1;
        if (bVar37) {
          pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
          lVar34 = (long)pOVar30 - (long)pOVar36 >> 3;
          if (1 < lVar34) {
            uVar35 = lVar34 - 2U >> 1;
            do {
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__0>>
                        (pOVar36,uVar35,lVar34,(pOVar36->Samples)._M_elems[uVar35]);
              bVar37 = uVar35 != 0;
              uVar35 = uVar35 - 1;
            } while (bVar37);
          }
          for (; pOVar30 < pOVar32; pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)
              ) {
            uVar35 = (pOVar36->Samples)._M_elems[0];
            if ((pOVar30->Samples)._M_elems[0] < uVar35) {
              (pOVar30->Samples)._M_elems[0] = uVar35;
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__0>>
                        (pOVar36,0,lVar34);
            }
          }
          uVar31 = (pOVar36->Samples)._M_elems[0];
          (pOVar36->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
          (pOVar1->Samples)._M_elems[0] = uVar31;
          goto LAB_001066c8;
        }
        uVar28 = (ulong)((long)pOVar32 - (long)pOVar36) >> 4;
        uVar35 = (pOVar36->Samples)._M_elems[1];
        uVar3._0_4_ = pOVar32[-1].SampleCount;
        uVar3._4_4_ = pOVar32[-1].SampleIndex;
        uVar29 = (pOVar36->Samples)._M_elems[uVar28];
        if (uVar35 < uVar29) {
          if (uVar29 < uVar3) {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            (pOVar36->Samples)._M_elems[0] = uVar29;
            (pOVar36->Samples)._M_elems[uVar28] = uVar31;
          }
          else {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            if (uVar3 <= uVar35) goto LAB_001065a6;
            (pOVar36->Samples)._M_elems[0] = uVar3;
            pOVar32[-1].SampleCount = (int)uVar31;
            pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
          }
        }
        else if (uVar35 < uVar3) {
          uVar31 = (pOVar36->Samples)._M_elems[0];
LAB_001065a6:
          (pOVar36->Samples)._M_elems[0] = uVar35;
          (pOVar36->Samples)._M_elems[1] = uVar31;
        }
        else {
          uVar31 = (pOVar36->Samples)._M_elems[0];
          if (uVar29 < uVar3) {
            (pOVar36->Samples)._M_elems[0] = uVar3;
            pOVar32[-1].SampleCount = (int)uVar31;
            pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
          }
          else {
            (pOVar36->Samples)._M_elems[0] = uVar29;
            (pOVar36->Samples)._M_elems[uVar28] = uVar31;
          }
        }
        pOVar30 = (OWDTimeStatistics *)((pOVar36->Samples)._M_elems + 1);
        pOVar26 = pOVar32;
        while( true ) {
          uVar35 = (pOVar36->Samples)._M_elems[0];
          do {
            pOVar25 = pOVar30;
            uVar3 = (pOVar25->Samples)._M_elems[0];
            pOVar30 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
          } while (uVar3 < uVar35);
          do {
            pOVar33 = pOVar26;
            uVar29._0_4_ = pOVar33[-1].SampleCount;
            uVar29._4_4_ = pOVar33[-1].SampleIndex;
            pOVar26 = (OWDTimeStatistics *)&pOVar33[-1].SampleCount;
          } while (uVar35 < uVar29);
          if (pOVar26 <= pOVar25) break;
          (pOVar25->Samples)._M_elems[0] = uVar29;
          pOVar33[-1].SampleCount = (int)uVar3;
          pOVar33[-1].SampleIndex = (int)(uVar3 >> 0x20);
        }
        pOVar30 = pOVar25;
        if (pOVar25 <= pOVar1) {
          pOVar30 = pOVar32;
          pOVar36 = pOVar25;
        }
      }
      pOVar30 = pOVar36;
      if (pOVar36 != pOVar32) {
        while (pOVar26 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1), pOVar26 != pOVar32)
        {
          uVar35 = (pOVar26->Samples)._M_elems[0];
          pOVar25 = pOVar26;
          if (uVar35 < (pOVar36->Samples)._M_elems[0]) {
            memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar26 - (long)pOVar36))),pOVar36,
                    (long)pOVar26 - (long)pOVar36);
            pOVar25 = pOVar36;
          }
          else {
            while (uVar27._0_4_ = pOVar25[-1].SampleCount, uVar27._4_4_ = pOVar25[-1].SampleIndex,
                  uVar35 < uVar27) {
              (pOVar25->Samples)._M_elems[0] = uVar27;
              pOVar25 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            }
          }
          (pOVar25->Samples)._M_elems[0] = uVar35;
          pOVar30 = pOVar26;
        }
      }
    }
LAB_001066c8:
    auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
    fVar22 = auVar21._0_4_;
    uVar35 = (ulong)this->SampleCount;
  }
  uVar23 = (uint)uVar35;
  if (100 < uVar23) {
    auVar21 = vcvtusi2sd_avx512f(in_XMM1,uVar23);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auVar21._0_8_ * 0.95;
    uVar27 = vcvttsd2usi_avx512f(auVar39);
    pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
    if (uVar27 != uVar35) {
      uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
      pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
      pOVar36 = this;
      while (pOVar32 = pOVar30, 0x18 < (long)pOVar32 - (long)pOVar36) {
        bVar37 = uVar27 == 0;
        uVar27 = uVar27 - 1;
        if (bVar37) {
          pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
          lVar34 = (long)pOVar30 - (long)pOVar36 >> 3;
          if (1 < lVar34) {
            uVar35 = lVar34 - 2U >> 1;
            do {
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__1>>
                        (pOVar36,uVar35,lVar34,(pOVar36->Samples)._M_elems[uVar35]);
              bVar37 = uVar35 != 0;
              uVar35 = uVar35 - 1;
            } while (bVar37);
          }
          for (; pOVar30 < pOVar32; pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)
              ) {
            uVar35 = (pOVar36->Samples)._M_elems[0];
            if ((pOVar30->Samples)._M_elems[0] < uVar35) {
              (pOVar30->Samples)._M_elems[0] = uVar35;
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__1>>
                        (pOVar36,0,lVar34);
            }
          }
          uVar31 = (pOVar36->Samples)._M_elems[0];
          (pOVar36->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
          (pOVar1->Samples)._M_elems[0] = uVar31;
          goto LAB_0010689d;
        }
        uVar29 = (ulong)((long)pOVar32 - (long)pOVar36) >> 4;
        uVar35 = (pOVar36->Samples)._M_elems[1];
        uVar28._0_4_ = pOVar32[-1].SampleCount;
        uVar28._4_4_ = pOVar32[-1].SampleIndex;
        uVar3 = (pOVar36->Samples)._M_elems[uVar29];
        if (uVar35 < uVar3) {
          if (uVar3 < uVar28) {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            (pOVar36->Samples)._M_elems[0] = uVar3;
            (pOVar36->Samples)._M_elems[uVar29] = uVar31;
          }
          else {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            if (uVar28 <= uVar35) goto LAB_0010677b;
            (pOVar36->Samples)._M_elems[0] = uVar28;
            pOVar32[-1].SampleCount = (int)uVar31;
            pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
          }
        }
        else if (uVar35 < uVar28) {
          uVar31 = (pOVar36->Samples)._M_elems[0];
LAB_0010677b:
          (pOVar36->Samples)._M_elems[0] = uVar35;
          (pOVar36->Samples)._M_elems[1] = uVar31;
        }
        else {
          uVar31 = (pOVar36->Samples)._M_elems[0];
          if (uVar3 < uVar28) {
            (pOVar36->Samples)._M_elems[0] = uVar28;
            pOVar32[-1].SampleCount = (int)uVar31;
            pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
          }
          else {
            (pOVar36->Samples)._M_elems[0] = uVar3;
            (pOVar36->Samples)._M_elems[uVar29] = uVar31;
          }
        }
        pOVar30 = (OWDTimeStatistics *)((pOVar36->Samples)._M_elems + 1);
        pOVar26 = pOVar32;
        while( true ) {
          uVar35 = (pOVar36->Samples)._M_elems[0];
          do {
            pOVar25 = pOVar30;
            uVar3 = (pOVar25->Samples)._M_elems[0];
            pOVar30 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
          } while (uVar3 < uVar35);
          do {
            pOVar33 = pOVar26;
            uVar4._0_4_ = pOVar33[-1].SampleCount;
            uVar4._4_4_ = pOVar33[-1].SampleIndex;
            pOVar26 = (OWDTimeStatistics *)&pOVar33[-1].SampleCount;
          } while (uVar35 < uVar4);
          if (pOVar26 <= pOVar25) break;
          (pOVar25->Samples)._M_elems[0] = uVar4;
          pOVar33[-1].SampleCount = (int)uVar3;
          pOVar33[-1].SampleIndex = (int)(uVar3 >> 0x20);
        }
        pOVar30 = pOVar25;
        if (pOVar25 <= pOVar1) {
          pOVar30 = pOVar32;
          pOVar36 = pOVar25;
        }
      }
      pOVar30 = pOVar36;
      if (pOVar36 != pOVar32) {
        while (pOVar26 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1), pOVar26 != pOVar32)
        {
          uVar35 = (pOVar26->Samples)._M_elems[0];
          pOVar25 = pOVar26;
          if (uVar35 < (pOVar36->Samples)._M_elems[0]) {
            memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar26 - (long)pOVar36))),pOVar36,
                    (long)pOVar26 - (long)pOVar36);
            pOVar25 = pOVar36;
          }
          else {
            while (uVar5._0_4_ = pOVar25[-1].SampleCount, uVar5._4_4_ = pOVar25[-1].SampleIndex,
                  uVar35 < uVar5) {
              (pOVar25->Samples)._M_elems[0] = uVar5;
              pOVar25 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            }
          }
          (pOVar25->Samples)._M_elems[0] = uVar35;
          pOVar30 = pOVar26;
        }
      }
    }
LAB_0010689d:
    auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
    uVar23 = this->SampleCount;
    local_1bc = auVar21._0_4_;
  }
  local_1c8 = 0.0;
  if (uVar23 < 5) {
    local_1cc = 0.0;
    local_1c4 = 0.0;
  }
  else {
    auVar21 = vcvtusi2sd_avx512f(in_XMM1,uVar23);
    uVar35 = (ulong)uVar23;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auVar21._0_8_ * 0.75;
    uVar27 = vcvttsd2usi_avx512f(auVar40);
    pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
    if (uVar27 != uVar35) {
      uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
      pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
      pOVar36 = this;
      while (pOVar32 = pOVar30, 0x18 < (long)pOVar32 - (long)pOVar36) {
        bVar37 = uVar27 == 0;
        uVar27 = uVar27 - 1;
        if (bVar37) {
          pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
          lVar34 = (long)pOVar30 - (long)pOVar36 >> 3;
          if (1 < lVar34) {
            uVar35 = lVar34 - 2U >> 1;
            do {
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__2>>
                        (pOVar36,uVar35,lVar34,(pOVar36->Samples)._M_elems[uVar35]);
              bVar37 = uVar35 != 0;
              uVar35 = uVar35 - 1;
            } while (bVar37);
          }
          for (; pOVar30 < pOVar32; pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)
              ) {
            uVar35 = (pOVar36->Samples)._M_elems[0];
            if ((pOVar30->Samples)._M_elems[0] < uVar35) {
              (pOVar30->Samples)._M_elems[0] = uVar35;
              std::
              __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__2>>
                        (pOVar36,0,lVar34);
            }
          }
          uVar31 = (pOVar36->Samples)._M_elems[0];
          (pOVar36->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
          (pOVar1->Samples)._M_elems[0] = uVar31;
          goto LAB_00106a93;
        }
        uVar29 = (ulong)((long)pOVar32 - (long)pOVar36) >> 4;
        uVar35 = (pOVar36->Samples)._M_elems[1];
        uVar6._0_4_ = pOVar32[-1].SampleCount;
        uVar6._4_4_ = pOVar32[-1].SampleIndex;
        uVar3 = (pOVar36->Samples)._M_elems[uVar29];
        if (uVar35 < uVar3) {
          if (uVar3 < uVar6) {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            (pOVar36->Samples)._M_elems[0] = uVar3;
            (pOVar36->Samples)._M_elems[uVar29] = uVar31;
          }
          else {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            if (uVar6 <= uVar35) goto LAB_0010695a;
            (pOVar36->Samples)._M_elems[0] = uVar6;
            pOVar32[-1].SampleCount = (int)uVar31;
            pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
          }
        }
        else if (uVar35 < uVar6) {
          uVar31 = (pOVar36->Samples)._M_elems[0];
LAB_0010695a:
          (pOVar36->Samples)._M_elems[0] = uVar35;
          (pOVar36->Samples)._M_elems[1] = uVar31;
        }
        else {
          uVar31 = (pOVar36->Samples)._M_elems[0];
          if (uVar3 < uVar6) {
            (pOVar36->Samples)._M_elems[0] = uVar6;
            pOVar32[-1].SampleCount = (int)uVar31;
            pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
          }
          else {
            (pOVar36->Samples)._M_elems[0] = uVar3;
            (pOVar36->Samples)._M_elems[uVar29] = uVar31;
          }
        }
        pOVar30 = (OWDTimeStatistics *)((pOVar36->Samples)._M_elems + 1);
        pOVar26 = pOVar32;
        while( true ) {
          uVar35 = (pOVar36->Samples)._M_elems[0];
          do {
            pOVar25 = pOVar30;
            uVar3 = (pOVar25->Samples)._M_elems[0];
            pOVar30 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
          } while (uVar3 < uVar35);
          do {
            pOVar33 = pOVar26;
            uVar7._0_4_ = pOVar33[-1].SampleCount;
            uVar7._4_4_ = pOVar33[-1].SampleIndex;
            pOVar26 = (OWDTimeStatistics *)&pOVar33[-1].SampleCount;
          } while (uVar35 < uVar7);
          if (pOVar26 <= pOVar25) break;
          (pOVar25->Samples)._M_elems[0] = uVar7;
          pOVar33[-1].SampleCount = (int)uVar3;
          pOVar33[-1].SampleIndex = (int)(uVar3 >> 0x20);
        }
        pOVar30 = pOVar25;
        if (pOVar25 <= pOVar1) {
          pOVar30 = pOVar32;
          pOVar36 = pOVar25;
        }
      }
      pOVar30 = pOVar36;
      if (pOVar36 != pOVar32) {
        while (pOVar26 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1), pOVar26 != pOVar32)
        {
          uVar35 = (pOVar26->Samples)._M_elems[0];
          pOVar25 = pOVar26;
          if (uVar35 < (pOVar36->Samples)._M_elems[0]) {
            memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar26 - (long)pOVar36))),pOVar36,
                    (long)pOVar26 - (long)pOVar36);
            pOVar25 = pOVar36;
          }
          else {
            while (uVar8._0_4_ = pOVar25[-1].SampleCount, uVar8._4_4_ = pOVar25[-1].SampleIndex,
                  uVar35 < uVar8) {
              (pOVar25->Samples)._M_elems[0] = uVar8;
              pOVar25 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            }
          }
          (pOVar25->Samples)._M_elems[0] = uVar35;
          pOVar30 = pOVar26;
        }
      }
    }
LAB_00106a93:
    auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
    uVar35 = (ulong)this->SampleCount;
    local_1c4 = auVar21._0_4_;
    if (uVar35 < 5) {
      local_1cc = 0.0;
    }
    else {
      auVar21 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = auVar21._0_8_ * 0.5;
      uVar27 = vcvttsd2usi_avx512f(auVar41);
      pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
      if (uVar27 != uVar35) {
        uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
        pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
        pOVar36 = this;
        while (pOVar32 = pOVar30, 0x18 < (long)pOVar32 - (long)pOVar36) {
          bVar37 = uVar27 == 0;
          uVar27 = uVar27 - 1;
          if (bVar37) {
            pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
            lVar34 = (long)pOVar30 - (long)pOVar36 >> 3;
            if (1 < lVar34) {
              uVar35 = lVar34 - 2U >> 1;
              do {
                std::
                __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__3>>
                          (pOVar36,uVar35,lVar34,(pOVar36->Samples)._M_elems[uVar35]);
                bVar37 = uVar35 != 0;
                uVar35 = uVar35 - 1;
              } while (bVar37);
            }
            for (; pOVar30 < pOVar32;
                pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)) {
              uVar35 = (pOVar36->Samples)._M_elems[0];
              if ((pOVar30->Samples)._M_elems[0] < uVar35) {
                (pOVar30->Samples)._M_elems[0] = uVar35;
                std::
                __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__3>>
                          (pOVar36,0,lVar34);
              }
            }
            uVar31 = (pOVar36->Samples)._M_elems[0];
            (pOVar36->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
            (pOVar1->Samples)._M_elems[0] = uVar31;
            goto LAB_00106c7c;
          }
          uVar29 = (ulong)((long)pOVar32 - (long)pOVar36) >> 4;
          uVar35 = (pOVar36->Samples)._M_elems[1];
          uVar9._0_4_ = pOVar32[-1].SampleCount;
          uVar9._4_4_ = pOVar32[-1].SampleIndex;
          uVar3 = (pOVar36->Samples)._M_elems[uVar29];
          if (uVar35 < uVar3) {
            if (uVar3 < uVar9) {
              uVar31 = (pOVar36->Samples)._M_elems[0];
              (pOVar36->Samples)._M_elems[0] = uVar3;
              (pOVar36->Samples)._M_elems[uVar29] = uVar31;
            }
            else {
              uVar31 = (pOVar36->Samples)._M_elems[0];
              if (uVar9 <= uVar35) goto LAB_00106b45;
              (pOVar36->Samples)._M_elems[0] = uVar9;
              pOVar32[-1].SampleCount = (int)uVar31;
              pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
            }
          }
          else if (uVar35 < uVar9) {
            uVar31 = (pOVar36->Samples)._M_elems[0];
LAB_00106b45:
            (pOVar36->Samples)._M_elems[0] = uVar35;
            (pOVar36->Samples)._M_elems[1] = uVar31;
          }
          else {
            uVar31 = (pOVar36->Samples)._M_elems[0];
            if (uVar3 < uVar9) {
              (pOVar36->Samples)._M_elems[0] = uVar9;
              pOVar32[-1].SampleCount = (int)uVar31;
              pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
            }
            else {
              (pOVar36->Samples)._M_elems[0] = uVar3;
              (pOVar36->Samples)._M_elems[uVar29] = uVar31;
            }
          }
          pOVar30 = (OWDTimeStatistics *)((pOVar36->Samples)._M_elems + 1);
          pOVar26 = pOVar32;
          while( true ) {
            uVar35 = (pOVar36->Samples)._M_elems[0];
            do {
              pOVar25 = pOVar30;
              uVar3 = (pOVar25->Samples)._M_elems[0];
              pOVar30 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
            } while (uVar3 < uVar35);
            do {
              pOVar33 = pOVar26;
              uVar10._0_4_ = pOVar33[-1].SampleCount;
              uVar10._4_4_ = pOVar33[-1].SampleIndex;
              pOVar26 = (OWDTimeStatistics *)&pOVar33[-1].SampleCount;
            } while (uVar35 < uVar10);
            if (pOVar26 <= pOVar25) break;
            (pOVar25->Samples)._M_elems[0] = uVar10;
            pOVar33[-1].SampleCount = (int)uVar3;
            pOVar33[-1].SampleIndex = (int)(uVar3 >> 0x20);
          }
          pOVar30 = pOVar25;
          if (pOVar25 <= pOVar1) {
            pOVar30 = pOVar32;
            pOVar36 = pOVar25;
          }
        }
        pOVar30 = pOVar36;
        if (pOVar36 != pOVar32) {
          while (pOVar26 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1),
                pOVar26 != pOVar32) {
            uVar35 = (pOVar26->Samples)._M_elems[0];
            pOVar25 = pOVar26;
            if (uVar35 < (pOVar36->Samples)._M_elems[0]) {
              memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar26 - (long)pOVar36))),pOVar36,
                      (long)pOVar26 - (long)pOVar36);
              pOVar25 = pOVar36;
            }
            else {
              while (uVar11._0_4_ = pOVar25[-1].SampleCount, uVar11._4_4_ = pOVar25[-1].SampleIndex,
                    uVar35 < uVar11) {
                (pOVar25->Samples)._M_elems[0] = uVar11;
                pOVar25 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
              }
            }
            (pOVar25->Samples)._M_elems[0] = uVar35;
            pOVar30 = pOVar26;
          }
        }
      }
LAB_00106c7c:
      auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
      uVar35 = (ulong)this->SampleCount;
      local_1cc = auVar21._0_4_;
      if (8 < uVar35) {
        auVar21 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auVar21._0_8_ * 0.25;
        uVar27 = vcvttsd2usi_avx512f(auVar42);
        pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
        if (uVar27 != uVar35) {
          uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
          pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
          pOVar36 = this;
          while (pOVar32 = pOVar30, 0x18 < (long)pOVar32 - (long)pOVar36) {
            bVar37 = uVar27 == 0;
            uVar27 = uVar27 - 1;
            if (bVar37) {
              pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
              lVar34 = (long)pOVar30 - (long)pOVar36 >> 3;
              if (1 < lVar34) {
                uVar35 = lVar34 - 2U >> 1;
                do {
                  std::
                  __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__4>>
                            (pOVar36,uVar35,lVar34,(pOVar36->Samples)._M_elems[uVar35]);
                  bVar37 = uVar35 != 0;
                  uVar35 = uVar35 - 1;
                } while (bVar37);
              }
              for (; pOVar30 < pOVar32;
                  pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)) {
                uVar35 = (pOVar36->Samples)._M_elems[0];
                if ((pOVar30->Samples)._M_elems[0] < uVar35) {
                  (pOVar30->Samples)._M_elems[0] = uVar35;
                  std::
                  __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__4>>
                            (pOVar36,0,lVar34);
                }
              }
              uVar31 = (pOVar36->Samples)._M_elems[0];
              (pOVar36->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
              (pOVar1->Samples)._M_elems[0] = uVar31;
              goto LAB_0010722d;
            }
            uVar29 = (ulong)((long)pOVar32 - (long)pOVar36) >> 4;
            uVar35 = (pOVar36->Samples)._M_elems[1];
            uVar12._0_4_ = pOVar32[-1].SampleCount;
            uVar12._4_4_ = pOVar32[-1].SampleIndex;
            uVar3 = (pOVar36->Samples)._M_elems[uVar29];
            if (uVar35 < uVar3) {
              if (uVar3 < uVar12) {
                uVar31 = (pOVar36->Samples)._M_elems[0];
                (pOVar36->Samples)._M_elems[0] = uVar3;
                (pOVar36->Samples)._M_elems[uVar29] = uVar31;
              }
              else {
                uVar31 = (pOVar36->Samples)._M_elems[0];
                if (uVar12 <= uVar35) goto LAB_00106d2e;
                (pOVar36->Samples)._M_elems[0] = uVar12;
                pOVar32[-1].SampleCount = (int)uVar31;
                pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
              }
            }
            else if (uVar35 < uVar12) {
              uVar31 = (pOVar36->Samples)._M_elems[0];
LAB_00106d2e:
              (pOVar36->Samples)._M_elems[0] = uVar35;
              (pOVar36->Samples)._M_elems[1] = uVar31;
            }
            else {
              uVar31 = (pOVar36->Samples)._M_elems[0];
              if (uVar3 < uVar12) {
                (pOVar36->Samples)._M_elems[0] = uVar12;
                pOVar32[-1].SampleCount = (int)uVar31;
                pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
              }
              else {
                (pOVar36->Samples)._M_elems[0] = uVar3;
                (pOVar36->Samples)._M_elems[uVar29] = uVar31;
              }
            }
            pOVar30 = (OWDTimeStatistics *)((pOVar36->Samples)._M_elems + 1);
            pOVar26 = pOVar32;
            while( true ) {
              uVar35 = (pOVar36->Samples)._M_elems[0];
              do {
                pOVar25 = pOVar30;
                uVar3 = (pOVar25->Samples)._M_elems[0];
                pOVar30 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
              } while (uVar3 < uVar35);
              do {
                pOVar33 = pOVar26;
                uVar13._0_4_ = pOVar33[-1].SampleCount;
                uVar13._4_4_ = pOVar33[-1].SampleIndex;
                pOVar26 = (OWDTimeStatistics *)&pOVar33[-1].SampleCount;
              } while (uVar35 < uVar13);
              if (pOVar26 <= pOVar25) break;
              (pOVar25->Samples)._M_elems[0] = uVar13;
              pOVar33[-1].SampleCount = (int)uVar3;
              pOVar33[-1].SampleIndex = (int)(uVar3 >> 0x20);
            }
            pOVar30 = pOVar25;
            if (pOVar25 <= pOVar1) {
              pOVar30 = pOVar32;
              pOVar36 = pOVar25;
            }
          }
          pOVar30 = pOVar36;
          if (pOVar36 != pOVar32) {
            while (pOVar26 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1),
                  pOVar26 != pOVar32) {
              uVar35 = (pOVar26->Samples)._M_elems[0];
              pOVar25 = pOVar26;
              if (uVar35 < (pOVar36->Samples)._M_elems[0]) {
                memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar26 - (long)pOVar36))),pOVar36,
                        (long)pOVar26 - (long)pOVar36);
                pOVar25 = pOVar36;
              }
              else {
                while (uVar14._0_4_ = pOVar25[-1].SampleCount,
                      uVar14._4_4_ = pOVar25[-1].SampleIndex, uVar35 < uVar14) {
                  (pOVar25->Samples)._M_elems[0] = uVar14;
                  pOVar25 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
                }
              }
              (pOVar25->Samples)._M_elems[0] = uVar35;
              pOVar30 = pOVar26;
            }
          }
        }
LAB_0010722d:
        auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
        uVar35 = (ulong)this->SampleCount;
        local_1d0 = auVar21._0_4_;
        if (uVar35 < 0x29) {
          local_1d4 = 0.0;
        }
        else {
          auVar21 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = auVar21._0_8_ * 0.05;
          uVar27 = vcvttsd2usi_avx512f(auVar43);
          pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
          if (uVar27 != uVar35) {
            uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
            pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
            pOVar36 = this;
            while (pOVar32 = pOVar30, 0x18 < (long)pOVar32 - (long)pOVar36) {
              bVar37 = uVar27 == 0;
              uVar27 = uVar27 - 1;
              if (bVar37) {
                pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
                lVar34 = (long)pOVar30 - (long)pOVar36 >> 3;
                if (1 < lVar34) {
                  uVar35 = lVar34 - 2U >> 1;
                  do {
                    std::
                    __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__5>>
                              (pOVar36,uVar35,lVar34,(pOVar36->Samples)._M_elems[uVar35]);
                    bVar37 = uVar35 != 0;
                    uVar35 = uVar35 - 1;
                  } while (bVar37);
                }
                for (; pOVar30 < pOVar32;
                    pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)) {
                  uVar35 = (pOVar36->Samples)._M_elems[0];
                  if ((pOVar30->Samples)._M_elems[0] < uVar35) {
                    (pOVar30->Samples)._M_elems[0] = uVar35;
                    std::
                    __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__5>>
                              (pOVar36,0,lVar34);
                  }
                }
                uVar31 = (pOVar36->Samples)._M_elems[0];
                (pOVar36->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
                (pOVar1->Samples)._M_elems[0] = uVar31;
                goto LAB_00107410;
              }
              uVar29 = (ulong)((long)pOVar32 - (long)pOVar36) >> 4;
              uVar35 = (pOVar36->Samples)._M_elems[1];
              uVar15._0_4_ = pOVar32[-1].SampleCount;
              uVar15._4_4_ = pOVar32[-1].SampleIndex;
              uVar3 = (pOVar36->Samples)._M_elems[uVar29];
              if (uVar35 < uVar3) {
                if (uVar3 < uVar15) {
                  uVar31 = (pOVar36->Samples)._M_elems[0];
                  (pOVar36->Samples)._M_elems[0] = uVar3;
                  (pOVar36->Samples)._M_elems[uVar29] = uVar31;
                }
                else {
                  uVar31 = (pOVar36->Samples)._M_elems[0];
                  if (uVar15 <= uVar35) goto LAB_001072df;
                  (pOVar36->Samples)._M_elems[0] = uVar15;
                  pOVar32[-1].SampleCount = (int)uVar31;
                  pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
                }
              }
              else if (uVar35 < uVar15) {
                uVar31 = (pOVar36->Samples)._M_elems[0];
LAB_001072df:
                (pOVar36->Samples)._M_elems[0] = uVar35;
                (pOVar36->Samples)._M_elems[1] = uVar31;
              }
              else {
                uVar31 = (pOVar36->Samples)._M_elems[0];
                if (uVar3 < uVar15) {
                  (pOVar36->Samples)._M_elems[0] = uVar15;
                  pOVar32[-1].SampleCount = (int)uVar31;
                  pOVar32[-1].SampleIndex = (int)(uVar31 >> 0x20);
                }
                else {
                  (pOVar36->Samples)._M_elems[0] = uVar3;
                  (pOVar36->Samples)._M_elems[uVar29] = uVar31;
                }
              }
              pOVar30 = (OWDTimeStatistics *)((pOVar36->Samples)._M_elems + 1);
              pOVar26 = pOVar32;
              while( true ) {
                uVar35 = (pOVar36->Samples)._M_elems[0];
                do {
                  pOVar25 = pOVar30;
                  uVar3 = (pOVar25->Samples)._M_elems[0];
                  pOVar30 = (OWDTimeStatistics *)((pOVar25->Samples)._M_elems + 1);
                } while (uVar3 < uVar35);
                do {
                  pOVar33 = pOVar26;
                  uVar16._0_4_ = pOVar33[-1].SampleCount;
                  uVar16._4_4_ = pOVar33[-1].SampleIndex;
                  pOVar26 = (OWDTimeStatistics *)&pOVar33[-1].SampleCount;
                } while (uVar35 < uVar16);
                if (pOVar26 <= pOVar25) break;
                (pOVar25->Samples)._M_elems[0] = uVar16;
                pOVar33[-1].SampleCount = (int)uVar3;
                pOVar33[-1].SampleIndex = (int)(uVar3 >> 0x20);
              }
              pOVar30 = pOVar25;
              if (pOVar25 <= pOVar1) {
                pOVar30 = pOVar32;
                pOVar36 = pOVar25;
              }
            }
            pOVar30 = pOVar36;
            if (pOVar36 != pOVar32) {
              while (pOVar26 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1),
                    pOVar26 != pOVar32) {
                uVar35 = (pOVar26->Samples)._M_elems[0];
                pOVar25 = pOVar26;
                if (uVar35 < (pOVar36->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar26 - (long)pOVar36))),pOVar36
                          ,(long)pOVar26 - (long)pOVar36);
                  pOVar25 = pOVar36;
                }
                else {
                  while (uVar17._0_4_ = pOVar25[-1].SampleCount,
                        uVar17._4_4_ = pOVar25[-1].SampleIndex, uVar35 < uVar17) {
                    (pOVar25->Samples)._M_elems[0] = uVar17;
                    pOVar25 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
                  }
                }
                (pOVar25->Samples)._M_elems[0] = uVar35;
                pOVar30 = pOVar26;
              }
            }
          }
LAB_00107410:
          auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
          uVar35 = (ulong)this->SampleCount;
          local_1d4 = auVar21._0_4_;
          if (200 < uVar35) {
            auVar21 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
            auVar44._8_8_ = 0;
            auVar44._0_8_ = auVar21._0_8_ * 0.01;
            uVar27 = vcvttsd2usi_avx512f(auVar44);
            pOVar1 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar27);
            if (uVar27 != uVar35) {
              uVar27 = (ulong)(uint)((int)LZCOUNT(uVar35) * 2) ^ 0x7e;
              pOVar30 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar35);
              while (pOVar36 = pOVar30, 0x18 < (long)pOVar36 - (long)this) {
                bVar37 = uVar27 == 0;
                uVar27 = uVar27 - 1;
                if (bVar37) {
                  pOVar30 = (OWDTimeStatistics *)((pOVar1->Samples)._M_elems + 1);
                  lVar34 = (long)pOVar30 - (long)this >> 3;
                  if (1 < lVar34) {
                    uVar35 = lVar34 - 2U >> 1;
                    do {
                      std::
                      __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__6>>
                                (this,uVar35,lVar34,(this->Samples)._M_elems[uVar35]);
                      bVar37 = uVar35 != 0;
                      uVar35 = uVar35 - 1;
                    } while (bVar37);
                  }
                  for (; pOVar30 < pOVar36;
                      pOVar30 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1)) {
                    uVar35 = (this->Samples)._M_elems[0];
                    if ((pOVar30->Samples)._M_elems[0] < uVar35) {
                      (pOVar30->Samples)._M_elems[0] = uVar35;
                      std::
                      __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__6>>
                                (this,0,lVar34);
                    }
                  }
                  uVar31 = (this->Samples)._M_elems[0];
                  (this->Samples)._M_elems[0] = (pOVar1->Samples)._M_elems[0];
                  (pOVar1->Samples)._M_elems[0] = uVar31;
                  goto LAB_001075f6;
                }
                uVar29 = (ulong)((long)pOVar36 - (long)this) >> 4;
                uVar35 = (this->Samples)._M_elems[1];
                uVar18._0_4_ = pOVar36[-1].SampleCount;
                uVar18._4_4_ = pOVar36[-1].SampleIndex;
                uVar3 = (this->Samples)._M_elems[uVar29];
                if (uVar35 < uVar3) {
                  if (uVar3 < uVar18) {
                    uVar31 = (this->Samples)._M_elems[0];
                    (this->Samples)._M_elems[0] = uVar3;
                    (this->Samples)._M_elems[uVar29] = uVar31;
                  }
                  else {
                    uVar31 = (this->Samples)._M_elems[0];
                    if (uVar18 <= uVar35) goto LAB_001074c8;
                    (this->Samples)._M_elems[0] = uVar18;
                    pOVar36[-1].SampleCount = (int)uVar31;
                    pOVar36[-1].SampleIndex = (int)(uVar31 >> 0x20);
                  }
                }
                else if (uVar35 < uVar18) {
                  uVar31 = (this->Samples)._M_elems[0];
LAB_001074c8:
                  (this->Samples)._M_elems[0] = uVar35;
                  (this->Samples)._M_elems[1] = uVar31;
                }
                else {
                  uVar31 = (this->Samples)._M_elems[0];
                  if (uVar3 < uVar18) {
                    (this->Samples)._M_elems[0] = uVar18;
                    pOVar36[-1].SampleCount = (int)uVar31;
                    pOVar36[-1].SampleIndex = (int)(uVar31 >> 0x20);
                  }
                  else {
                    (this->Samples)._M_elems[0] = uVar3;
                    (this->Samples)._M_elems[uVar29] = uVar31;
                  }
                }
                pOVar32 = (OWDTimeStatistics *)((this->Samples)._M_elems + 1);
                pOVar26 = pOVar36;
                while( true ) {
                  uVar35 = (this->Samples)._M_elems[0];
                  do {
                    pOVar30 = pOVar32;
                    uVar3 = (pOVar30->Samples)._M_elems[0];
                    pOVar32 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
                  } while (uVar3 < uVar35);
                  do {
                    pOVar25 = pOVar26;
                    uVar19._0_4_ = pOVar25[-1].SampleCount;
                    uVar19._4_4_ = pOVar25[-1].SampleIndex;
                    pOVar26 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
                  } while (uVar35 < uVar19);
                  if (pOVar26 <= pOVar30) break;
                  (pOVar30->Samples)._M_elems[0] = uVar19;
                  pOVar25[-1].SampleCount = (int)uVar3;
                  pOVar25[-1].SampleIndex = (int)(uVar3 >> 0x20);
                }
                if (pOVar30 <= pOVar1) {
                  this = pOVar30;
                  pOVar30 = pOVar36;
                }
              }
              pOVar30 = this;
              if (this != pOVar36) {
                while (pOVar32 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1),
                      pOVar32 != pOVar36) {
                  uVar35 = (pOVar32->Samples)._M_elems[0];
                  pOVar26 = pOVar32;
                  if (uVar35 < (this->Samples)._M_elems[0]) {
                    memmove((void *)((long)pOVar30 + (0x10 - ((long)pOVar32 - (long)this))),this,
                            (long)pOVar32 - (long)this);
                    pOVar26 = this;
                  }
                  else {
                    while (uVar20._0_4_ = pOVar26[-1].SampleCount,
                          uVar20._4_4_ = pOVar26[-1].SampleIndex, uVar35 < uVar20) {
                      (pOVar26->Samples)._M_elems[0] = uVar20;
                      pOVar26 = (OWDTimeStatistics *)&pOVar26[-1].SampleCount;
                    }
                  }
                  (pOVar26->Samples)._M_elems[0] = uVar35;
                  pOVar30 = pOVar32;
                }
              }
            }
LAB_001075f6:
            auVar21 = vcvtusi2ss_avx512f(in_XMM1,(pOVar1->Samples)._M_elems[0]);
            local_1c8 = auVar21._0_4_;
          }
        }
        goto LAB_00106da3;
      }
    }
  }
  local_1d4 = 0.0;
  local_1d0 = 0.0;
LAB_00106da3:
  if (DAT_0010f268 < 3) {
    poVar2 = &local_1b8.LogStream;
    local_1b8.ChannelName = Logger;
    local_1b8.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
    std::operator<<((ostream *)poVar2,"One-way  1% percentile latency = ");
    std::ostream::operator<<((ostream *)poVar2,fVar22 / 1000.0);
    std::operator<<((ostream *)poVar2," msec");
    pOVar24 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar24,&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
    if (DAT_0010f268 < 3) {
      poVar2 = &local_1b8.LogStream;
      local_1b8.ChannelName = Logger;
      local_1b8.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
      std::operator<<((ostream *)poVar2,"One-way  5% percentile latency = ");
      std::ostream::operator<<((ostream *)poVar2,local_1bc / 1000.0);
      std::operator<<((ostream *)poVar2," msec");
      pOVar24 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar24,&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      if (DAT_0010f268 < 3) {
        poVar2 = &local_1b8.LogStream;
        local_1b8.ChannelName = Logger;
        local_1b8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
        std::operator<<((ostream *)poVar2,"One-way 25% percentile latency = ");
        std::ostream::operator<<((ostream *)poVar2,local_1c4 / 1000.0);
        std::operator<<((ostream *)poVar2," msec");
        pOVar24 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar24,&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
        if (DAT_0010f268 < 3) {
          poVar2 = &local_1b8.LogStream;
          local_1b8.ChannelName = Logger;
          local_1b8.LogLevel = Info;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
          std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
          std::operator<<((ostream *)poVar2,"One-way 50% percentile latency = ");
          std::ostream::operator<<((ostream *)poVar2,local_1cc / 1000.0);
          std::operator<<((ostream *)poVar2," msec (median)");
          pOVar24 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar24,&local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
          if (DAT_0010f268 < 3) {
            poVar2 = &local_1b8.LogStream;
            local_1b8.ChannelName = Logger;
            local_1b8.LogLevel = Info;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
            std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
            std::operator<<((ostream *)poVar2,"One-way 75% percentile latency = ");
            std::ostream::operator<<((ostream *)poVar2,local_1d0 / 1000.0);
            std::operator<<((ostream *)poVar2," msec");
            pOVar24 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar24,&local_1b8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
            if (DAT_0010f268 < 3) {
              poVar2 = &local_1b8.LogStream;
              local_1b8.ChannelName = Logger;
              local_1b8.LogLevel = Info;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
              std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
              std::operator<<((ostream *)poVar2,"One-way 95% percentile latency = ");
              std::ostream::operator<<((ostream *)poVar2,local_1d4 / 1000.0);
              std::operator<<((ostream *)poVar2," msec");
              pOVar24 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar24,&local_1b8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
              if (DAT_0010f268 < 3) {
                poVar2 = &local_1b8.LogStream;
                local_1b8.ChannelName = Logger;
                local_1b8.LogLevel = Info;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
                std::operator<<((ostream *)poVar2,(string *)&DAT_0010f298);
                std::operator<<((ostream *)poVar2,"One-way 99% percentile latency = ");
                std::ostream::operator<<((ostream *)poVar2,local_1c8 / 1000.0);
                std::operator<<((ostream *)poVar2," msec");
                pOVar24 = logger::OutputWorker::GetInstance();
                logger::OutputWorker::Write(pOVar24,&local_1b8);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void OWDTimeStatistics::PrintStatistics()
{
    uint64_t percentile1 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.99 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile1 = Samples[goalOffset];
    }

    uint64_t percentile5 = 0;
    if (SampleCount > 100)
    {
        offset_t goalOffset = (offset_t)(0.95 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile5 = Samples[goalOffset];
    }

    uint64_t percentile25 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.75 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile25 = Samples[goalOffset];
    }

    uint64_t percentile50 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.5 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile50 = Samples[goalOffset];
    }

    uint64_t percentile75 = 0;
    if (SampleCount > 8)
    {
        offset_t goalOffset = (offset_t)(0.25 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile75 = Samples[goalOffset];
    }

    uint64_t percentile95 = 0;
    if (SampleCount > 40)
    {
        offset_t goalOffset = (offset_t)(0.05 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile95 = Samples[goalOffset];
    }

    uint64_t percentile99 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.01 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile99 = Samples[goalOffset];
    }

    Logger.Info("One-way  1% percentile latency = ", percentile1 / 1000.f, " msec");
    Logger.Info("One-way  5% percentile latency = ", percentile5 / 1000.f, " msec");
    Logger.Info("One-way 25% percentile latency = ", percentile25 / 1000.f, " msec");
    Logger.Info("One-way 50% percentile latency = ", percentile50 / 1000.f, " msec (median)");
    Logger.Info("One-way 75% percentile latency = ", percentile75 / 1000.f, " msec");
    Logger.Info("One-way 95% percentile latency = ", percentile95 / 1000.f, " msec");
    Logger.Info("One-way 99% percentile latency = ", percentile99 / 1000.f, " msec");
}